

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

Value __thiscall jbcoin::STObject::getJson(STObject *this,int options)

{
  ValueHolder VVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  ushort uVar6;
  undefined4 uVar7;
  int iVar8;
  _func_int **pp_Var9;
  ValueHolder *pVVar10;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  undefined4 in_register_00000034;
  long lVar12;
  Value VVar13;
  string key;
  ValueHolder local_60;
  ushort local_58;
  long *local_50 [2];
  long local_40 [2];
  
  *(ushort *)&(this->super_STBase).fName =
       (ushort)*(undefined4 *)&(this->super_STBase).fName & 0xfe00 | 7;
  pp_Var9 = (_func_int **)operator_new(0x30);
  pp_Var9[2] = (_func_int *)0x0;
  pp_Var9[3] = (_func_int *)0x0;
  *pp_Var9 = (_func_int *)0x0;
  pp_Var9[1] = (_func_int *)0x0;
  pp_Var9[3] = (_func_int *)(pp_Var9 + 1);
  pp_Var9[4] = (_func_int *)(pp_Var9 + 1);
  pp_Var9[5] = (_func_int *)0x0;
  (this->super_STBase)._vptr_STBase = pp_Var9;
  lVar12 = *(long *)(CONCAT44(in_register_00000034,options) + 0x10);
  lVar4 = *(long *)(CONCAT44(in_register_00000034,options) + 0x18);
  uVar11 = extraout_RDX;
  if (lVar12 != lVar4) {
    do {
      iVar8 = (**(code **)(**(long **)(lVar12 + 0x50) + 0x20))();
      uVar11 = extraout_RDX_00;
      if (iVar8 != 0) {
        lVar5 = *(long *)(*(long *)(lVar12 + 0x50) + 8);
        if (*(long *)(lVar5 + 0x18) == 0) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
          *(undefined1 *)local_50[0] = 0x31;
        }
        else {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,*(long *)(lVar5 + 0x40),
                     *(long *)(lVar5 + 0x48) + *(long *)(lVar5 + 0x40));
        }
        (**(code **)(**(long **)(lVar12 + 0x50) + 0x38))(&local_60,*(long **)(lVar12 + 0x50),in_EDX)
        ;
        pVVar10 = &Json::Value::resolveReference((Value *)this,(char *)local_50[0],false)->value_;
        uVar7 = _local_58;
        VVar1 = *pVVar10;
        *pVVar10 = local_60;
        bVar2 = pVVar10[1].bool_;
        pVVar10[1].bool_ = local_58._0_1_;
        uVar6 = local_58;
        _local_58 = CONCAT31(stack0xffffffffffffffa9,bVar2);
        uVar3 = *(ushort *)(pVVar10 + 1);
        *(ushort *)(pVVar10 + 1) = uVar3 & 0xfeff | uVar6 & 0x100;
        uVar6 = (ushort)_local_58;
        _local_58 = CONCAT22(SUB42(uVar7,2),uVar6 & 0xfeff | uVar3 & 0x100);
        local_60 = VVar1;
        Json::Value::~Value((Value *)&local_60);
        uVar11 = extraout_RDX_01;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
          uVar11 = extraout_RDX_02;
        }
      }
      lVar12 = lVar12 + 0x60;
    } while (lVar12 != lVar4);
  }
  VVar13._8_8_ = uVar11;
  VVar13.value_.map_ = (ObjectValues *)this;
  return VVar13;
}

Assistant:

Json::Value STObject::getJson (int options) const
{
    Json::Value ret (Json::objectValue);

    // TODO(tom): this variable is never changed...?
    int index = 1;
    for (auto const& elem : v_)
    {
        if (elem->getSType () != STI_NOTPRESENT)
        {
            auto const& n = elem->getFName ();
            auto key = n.hasName () ? std::string(n.getJsonName ()) :
                    std::to_string (index);
            ret[key] = elem->getJson (options);
        }
    }
    return ret;
}